

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_delegate_definition(writer *w,TypeDef *type)

{
  bool bVar1;
  string_view sVar2;
  MethodDef MVar3;
  anon_class_8_1_89897ddb_conflict1 local_368;
  anon_class_8_1_89897ddb_conflict1 local_360;
  bool local_351;
  anon_class_16_2_3ed68039_conflict local_350;
  anon_class_8_1_89897ddb_conflict1 local_340;
  basic_string_view<char,_std::char_traits<char>_> local_338;
  char *local_328;
  char *format_1;
  anon_class_8_1_89897ddb_conflict1 local_318;
  basic_string_view<char,_std::char_traits<char>_> local_310;
  anon_class_16_2_560cd874 local_300;
  bool local_2e9;
  anon_class_16_2_3ed68039_conflict local_2e8;
  anon_class_8_1_89897ddb_conflict1 local_2d8;
  basic_string_view<char,_std::char_traits<char>_> local_2d0;
  anon_class_16_2_560cd874 local_2c0;
  anon_class_8_1_89897ddb local_2b0;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  anon_class_16_2_560cd874 local_298;
  anon_class_8_1_89897ddb local_288;
  basic_string_view<char,_std::char_traits<char>_> local_280;
  anon_class_16_2_560cd874 local_270;
  anon_class_8_1_89897ddb local_260;
  basic_string_view<char,_std::char_traits<char>_> local_258;
  anon_class_16_2_560cd874 local_248;
  anon_class_8_1_89897ddb local_238;
  basic_string_view<char,_std::char_traits<char>_> local_230;
  anon_class_16_2_560cd874 local_220;
  anon_class_8_1_89897ddb local_210;
  basic_string_view<char,_std::char_traits<char>_> local_208;
  anon_class_16_2_560cd874 local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  anon_class_16_2_560cd874 local_1d8;
  anon_class_8_1_89897ddb local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  basic_string_view<char,_std::char_traits<char>_> local_1b0;
  char *local_1a0;
  char *format;
  uint32_t local_190;
  MethodDef local_188;
  undefined1 local_178 [8];
  method_signature signature;
  undefined1 auStack_58 [8];
  string_view type_name;
  undefined1 local_40 [8];
  generic_param_guard guard;
  pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> generics;
  TypeDef *type_local;
  writer *w_local;
  
  winmd::reader::TypeDef::GenericParam
            ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard,type);
  writer::push_generic_params
            ((writer *)local_40,(pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)w)
  ;
  sVar2 = winmd::reader::TypeDef::TypeName(type);
  type_name._M_len = (size_t)sVar2._M_str;
  auStack_58 = (undefined1  [8])sVar2._M_len;
  MVar3 = get_delegate_method(type);
  format = (char *)MVar3.super_row_base<winmd::reader::MethodDef>.m_table;
  local_190 = MVar3.super_row_base<winmd::reader::MethodDef>.m_index;
  local_188.super_row_base<winmd::reader::MethodDef>.m_table = (table_base *)format;
  local_188.super_row_base<winmd::reader::MethodDef>.m_index = local_190;
  method_signature::method_signature((method_signature *)local_178,&local_188);
  bVar1 = winmd::reader::empty<winmd::reader::GenericParam>
                    ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard);
  if (bVar1) {
    local_328 = 
    "    template <typename L> %::%(L handler) :\n        %(impl::make_delegate<%>(std::forward<L>(handler)))\n    {\n    }\n    template <typename F> %::%(F* handler) :\n        %([=](auto&&... args) { return handler(args...); })\n    {\n    }\n    template <typename O, typename M> %::%(O* object, M method) :\n        %([=](auto&&... args) { return ((*object).*(method))(args...); })\n    {\n    }\n    template <typename O, typename M> %::%(com_ptr<O>&& object, M method) :\n        %([o = std::move(object), method](auto&&... args) { return ((*o).*(method))(args...); })\n    {\n    }\n    template <typename O, typename M> %::%(weak_ref<O>&& object, M method) :\n        %([o = std::move(object), method](auto&&... args) { if (auto s = o.get()) { ((*s).*(method))(args...); } })\n    {\n    }\n    inline auto %::operator()(%) const\n    {%\n        check_hresult((*(impl::abi_t<%>**)this)->Invoke(%));%\n    }\n"
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_338,
               "    template <typename L> %::%(L handler) :\n        %(impl::make_delegate<%>(std::forward<L>(handler)))\n    {\n    }\n    template <typename F> %::%(F* handler) :\n        %([=](auto&&... args) { return handler(args...); })\n    {\n    }\n    template <typename O, typename M> %::%(O* object, M method) :\n        %([=](auto&&... args) { return ((*object).*(method))(args...); })\n    {\n    }\n    template <typename O, typename M> %::%(com_ptr<O>&& object, M method) :\n        %([o = std::move(object), method](auto&&... args) { return ((*o).*(method))(args...); })\n    {\n    }\n    template <typename O, typename M> %::%(weak_ref<O>&& object, M method) :\n        %([o = std::move(object), method](auto&&... args) { if (auto s = o.get()) { ((*s).*(method))(args...); } })\n    {\n    }\n    inline auto %::operator()(%) const\n    {%\n        check_hresult((*(impl::abi_t<%>**)this)->Invoke(%));%\n    }\n"
              );
    local_340 = bind<&cppwinrt::write_consume_params,_cppwinrt::method_signature_&>
                          ((method_signature *)local_178);
    local_351 = true;
    local_350 = bind<&cppwinrt::write_consume_return_type,_cppwinrt::method_signature_&,_bool>
                          ((method_signature *)local_178,&local_351);
    local_360 = bind<&cppwinrt::write_abi_args,_cppwinrt::method_signature_&>
                          ((method_signature *)local_178);
    local_368 = bind<&cppwinrt::write_consume_return_statement,_cppwinrt::method_signature_&>
                          ((method_signature *)local_178);
    writer_base<cppwinrt::writer>::
    write<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16)>
              (&w->super_writer_base<cppwinrt::writer>,&local_338,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_340,&local_350,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_360,&local_368)
    ;
  }
  else {
    local_1a0 = 
    "    template <%> template <typename L> %<%>::%(L handler) :\n        %(impl::make_delegate<%<%>>(std::forward<L>(handler)))\n    {\n    }\n    template <%> template <typename F> %<%>::%(F* handler) :\n        %([=](auto&&... args) { return handler(args...); })\n    {\n    }\n    template <%> template <typename O, typename M> %<%>::%(O* object, M method) :\n        %([=](auto&&... args) { return ((*object).*(method))(args...); })\n    {\n    }\n    template <%> template <typename O, typename M> %<%>::%(com_ptr<O>&& object, M method) :\n        %([o = std::move(object), method](auto&&... args) { return ((*o).*(method))(args...); })\n    {\n    }\n    template <%> template <typename O, typename M> %<%>::%(weak_ref<O>&& object, M method) :\n        %([o = std::move(object), method](auto&&... args) { if (auto s = o.get()) { ((*s).*(method))(args...); } })\n    {\n    }\n    template <%> auto %<%>::operator()(%) const\n    {%\n        check_hresult((*(impl::abi_t<%<%>>**)this)->Invoke(%));%\n    }\n"
    ;
    local_1b0 = remove_tick((string_view *)auStack_58);
    type_name._M_len = (size_t)local_1b0._M_str;
    auStack_58 = (undefined1  [8])local_1b0._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1c0,local_1a0);
    local_1c8 = bind<&cppwinrt::write_generic_typenames,_std::pair<winmd::reader::GenericParam,_winmd::reader::GenericParam>_&>
                          ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e8,", ");
    local_1d8 = bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>
                          (&local_1e8,
                           (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_208,", ");
    local_1f8 = bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>
                          (&local_208,
                           (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    local_210 = bind<&cppwinrt::write_generic_typenames,_std::pair<winmd::reader::GenericParam,_winmd::reader::GenericParam>_&>
                          ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_230,", ");
    local_220 = bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>
                          (&local_230,
                           (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    local_238 = bind<&cppwinrt::write_generic_typenames,_std::pair<winmd::reader::GenericParam,_winmd::reader::GenericParam>_&>
                          ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_258,", ");
    local_248 = bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>
                          (&local_258,
                           (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    local_260 = bind<&cppwinrt::write_generic_typenames,_std::pair<winmd::reader::GenericParam,_winmd::reader::GenericParam>_&>
                          ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_280,", ");
    local_270 = bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>
                          (&local_280,
                           (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    local_288 = bind<&cppwinrt::write_generic_typenames,_std::pair<winmd::reader::GenericParam,_winmd::reader::GenericParam>_&>
                          ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a8,", ");
    local_298 = bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>
                          (&local_2a8,
                           (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    local_2b0 = bind<&cppwinrt::write_generic_typenames,_std::pair<winmd::reader::GenericParam,_winmd::reader::GenericParam>_&>
                          ((pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2d0,", ");
    local_2c0 = bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>
                          (&local_2d0,
                           (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    local_2d8 = bind<&cppwinrt::write_consume_params,_cppwinrt::method_signature_&>
                          ((method_signature *)local_178);
    local_2e9 = true;
    local_2e8 = bind<&cppwinrt::write_consume_return_type,_cppwinrt::method_signature_&,_bool>
                          ((method_signature *)local_178,&local_2e9);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_310,", ");
    local_300 = bind_list<std::pair<winmd::reader::GenericParam,winmd::reader::GenericParam>>
                          (&local_310,
                           (pair<winmd::reader::GenericParam,_winmd::reader::GenericParam> *)&guard)
    ;
    local_318 = bind<&cppwinrt::write_abi_args,_cppwinrt::method_signature_&>
                          ((method_signature *)local_178);
    format_1 = (char *)bind<&cppwinrt::write_consume_return_statement,_cppwinrt::method_signature_&>
                                 ((method_signature *)local_178);
    writer_base<cppwinrt::writer>::write<_a1cf3ae8_>
              (&w->super_writer_base<cppwinrt::writer>,&local_1c0,&local_1c8,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_1d8,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_1f8,&local_210,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_220,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_238,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_248,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_260,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_270,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_288,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_298,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_2b0,
               (basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_2c0,&local_2d8,
               &local_2e8,(basic_string_view<char,_std::char_traits<char>_> *)auStack_58,&local_300,
               &local_318,(anon_class_8_1_89897ddb_conflict1 *)&format_1);
  }
  method_signature::~method_signature((method_signature *)local_178);
  writer::generic_param_guard::~generic_param_guard((generic_param_guard *)local_40);
  return;
}

Assistant:

static void write_delegate_definition(writer& w, TypeDef const& type)
    {
        auto generics = type.GenericParam();
        auto guard{ w.push_generic_params(generics) };
        auto type_name = type.TypeName();
        method_signature signature{ get_delegate_method(type) };

        if (!empty(generics))
        {
            auto format = R"(    template <%> template <typename L> %<%>::%(L handler) :
        %(impl::make_delegate<%<%>>(std::forward<L>(handler)))
    {
    }
    template <%> template <typename F> %<%>::%(F* handler) :
        %([=](auto&&... args) { return handler(args...); })
    {
    }
    template <%> template <typename O, typename M> %<%>::%(O* object, M method) :
        %([=](auto&&... args) { return ((*object).*(method))(args...); })
    {
    }
    template <%> template <typename O, typename M> %<%>::%(com_ptr<O>&& object, M method) :
        %([o = std::move(object), method](auto&&... args) { return ((*o).*(method))(args...); })
    {
    }
    template <%> template <typename O, typename M> %<%>::%(weak_ref<O>&& object, M method) :
        %([o = std::move(object), method](auto&&... args) { if (auto s = o.get()) { ((*s).*(method))(args...); } })
    {
    }
    template <%> auto %<%>::operator()(%) const
    {%
        check_hresult((*(impl::abi_t<%<%>>**)this)->Invoke(%));%
    }
)";

            type_name = remove_tick(type_name);

            w.write(format,
                bind<write_generic_typenames>(generics),
                type_name,
                bind_list(", ", generics),
                type_name,
                type_name,
                type_name,
                bind_list(", ", generics),
                bind<write_generic_typenames>(generics),
                type_name,
                bind_list(", ", generics),
                type_name,
                type_name,
                bind<write_generic_typenames>(generics),
                type_name,
                bind_list(", ", generics),
                type_name,
                type_name,
                bind<write_generic_typenames>(generics),
                type_name,
                bind_list(", ", generics),
                type_name,
                type_name,
                bind<write_generic_typenames>(generics),
                type_name,
                bind_list(", ", generics),
                type_name,
                type_name,
                bind<write_generic_typenames>(generics),
                type_name,
                bind_list(", ", generics),
                bind<write_consume_params>(signature),
                bind<write_consume_return_type>(signature, true),
                type_name,
                bind_list(", ", generics),
                bind<write_abi_args>(signature),
                bind<write_consume_return_statement>(signature));
        }
        else
        {
            auto format = R"(    template <typename L> %::%(L handler) :
        %(impl::make_delegate<%>(std::forward<L>(handler)))
    {
    }
    template <typename F> %::%(F* handler) :
        %([=](auto&&... args) { return handler(args...); })
    {
    }
    template <typename O, typename M> %::%(O* object, M method) :
        %([=](auto&&... args) { return ((*object).*(method))(args...); })
    {
    }
    template <typename O, typename M> %::%(com_ptr<O>&& object, M method) :
        %([o = std::move(object), method](auto&&... args) { return ((*o).*(method))(args...); })
    {
    }
    template <typename O, typename M> %::%(weak_ref<O>&& object, M method) :
        %([o = std::move(object), method](auto&&... args) { if (auto s = o.get()) { ((*s).*(method))(args...); } })
    {
    }
    inline auto %::operator()(%) const
    {%
        check_hresult((*(impl::abi_t<%>**)this)->Invoke(%));%
    }
)";

            w.write(format,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                type_name,
                bind<write_consume_params>(signature),
                bind<write_consume_return_type>(signature, true),
                type_name,
                bind<write_abi_args>(signature),
                bind<write_consume_return_statement>(signature));
        }
    }